

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  undefined8 *puVar2;
  protobuf *this_00;
  bool bVar3;
  long lVar4;
  LogMessage *other;
  uint *dest;
  int i;
  int extraout_EDX;
  TextGenerator *extraout_RDX;
  unsigned_long i_00;
  TextGenerator *extraout_RDX_00;
  TextGenerator *extraout_RDX_01;
  TextGenerator *extraout_RDX_02;
  TextGenerator *extraout_RDX_03;
  TextGenerator *extraout_RDX_04;
  TextGenerator *pTVar5;
  TextGenerator *extraout_RDX_05;
  pointer pUVar6;
  char *pcVar7;
  UnknownFieldSet UVar8;
  size_t size;
  long lVar9;
  long lVar10;
  Hex hex;
  Hex hex_00;
  StringPiece src;
  UnknownFieldSet embedded_unknown_fields;
  string printed;
  string field_number;
  UnknownFieldSet local_e8;
  size_t local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [48];
  string local_98;
  string *local_78;
  UnknownFieldSet *local_70;
  LogMessage local_68;
  
  local_78 = &generator->indent_;
  lVar9 = 8;
  lVar10 = 0;
  pTVar5 = generator;
  local_70 = unknown_fields;
  do {
    i = (int)pTVar5;
    pvVar1 = local_70->fields_;
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (long)(int)((ulong)((long)(pvVar1->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar1->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar4 <= lVar10) {
      return;
    }
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                 ,0x11c);
      other = internal::LogMessage::operator<<(&local_68,"CHECK failed: fields_ != NULL: ");
      internal::LogFinisher::operator=((LogFinisher *)local_c8,other);
      internal::LogMessage::~LogMessage(&local_68);
      i = extraout_EDX;
    }
    pUVar6 = (local_70->fields_->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    SimpleItoa_abi_cxx11_(&local_98,(protobuf *)(ulong)*(uint *)((long)pUVar6 + lVar9 + -8),i);
    dest = &switchD_005d8749::switchdataD_0063cfc0;
    pTVar5 = extraout_RDX;
    switch(*(undefined4 *)((long)pUVar6 + lVar9 + -4)) {
    case 0:
      TextGenerator::Print(generator,local_98._M_dataplus._M_p,local_98._M_string_length);
      TextGenerator::Print(generator,": ",2);
      if (*(int *)((long)pUVar6 + lVar9 + -4) != 0) {
        __assert_fail("type() == TYPE_VARINT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x131,"uint64 google::protobuf::UnknownField::varint() const");
      }
      SimpleItoa_abi_cxx11_((string *)local_c8,*(protobuf **)((long)&pUVar6->number_ + lVar9),i_00);
      TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
      pUVar6 = (pointer)local_c8._16_8_;
      UVar8.fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)local_c8._0_8_;
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) goto LAB_005d896e;
      goto LAB_005d8976;
    case 1:
      TextGenerator::Print(generator,local_98._M_dataplus._M_p,local_98._M_string_length);
      TextGenerator::Print(generator,": 0x",4);
      if (*(int *)((long)pUVar6 + lVar9 + -4) != 1) {
        __assert_fail("type() == TYPE_FIXED32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x135,"uint32 google::protobuf::UnknownField::fixed32() const");
      }
      hex_00.value = (ulong)*(uint *)((long)&pUVar6->number_ + lVar9);
      hex_00._8_8_ = 8;
      strings::AlphaNum::AlphaNum((AlphaNum *)local_c8,hex_00);
      local_e8.fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,local_c8._0_8_,(char *)(local_c8._0_8_ + local_c8._8_8_));
      TextGenerator::Print(generator,(char *)local_e8.fields_,local_e0);
      goto LAB_005d895f;
    case 2:
      TextGenerator::Print(generator,local_98._M_dataplus._M_p,local_98._M_string_length);
      TextGenerator::Print(generator,": 0x",4);
      if (*(int *)((long)pUVar6 + lVar9 + -4) != 2) {
        __assert_fail("type() == TYPE_FIXED64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x139,"uint64 google::protobuf::UnknownField::fixed64() const");
      }
      hex._8_8_ = 0x10;
      hex.value = *(uint64 *)((long)&pUVar6->number_ + lVar9);
      strings::AlphaNum::AlphaNum((AlphaNum *)local_c8,hex);
      local_e8.fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,local_c8._0_8_,(char *)(local_c8._0_8_ + local_c8._8_8_));
      TextGenerator::Print(generator,(char *)local_e8.fields_,local_e0);
LAB_005d895f:
      pUVar6 = (pointer)local_d8._0_8_;
      UVar8.fields_ = local_e8.fields_;
      if (local_e8.fields_ !=
          (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *
          )local_d8) {
LAB_005d896e:
        operator_delete(UVar8.fields_,(ulong)((long)&pUVar6->number_ + 1));
      }
LAB_005d8976:
      pcVar7 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar7 = " ";
      }
      size = 1;
LAB_005d8997:
      TextGenerator::Print(generator,pcVar7,size);
      pTVar5 = extraout_RDX_00;
      break;
    case 3:
      TextGenerator::Print(generator,local_98._M_dataplus._M_p,local_98._M_string_length);
      if (*(int *)((long)pUVar6 + lVar9 + -4) != 3) {
        __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x13d,
                      "const string &google::protobuf::UnknownField::length_delimited() const");
      }
      puVar2 = *(undefined8 **)((long)&pUVar6->number_ + lVar9);
      local_e8.fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
      if ((puVar2[1] == 0) ||
         (bVar3 = UnknownFieldSet::ParseFromArray(&local_e8,(void *)*puVar2,(int)puVar2[1]), !bVar3)
         ) {
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,": \"","");
        this_00 = (protobuf *)*puVar2;
        pcVar7 = (char *)puVar2[1];
        if ((long)pcVar7 < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)pcVar7,"size_t to int conversion");
        }
        src.length_ = (stringpiece_ssize_type)local_c8;
        src.ptr_ = pcVar7;
        CEscapeAndAppend(this_00,src,(string *)dest);
        std::__cxx11::string::append(local_c8);
        TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
        pTVar5 = extraout_RDX_02;
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          pTVar5 = extraout_RDX_03;
        }
      }
      else {
        if (this->single_line_mode_ == true) {
          TextGenerator::Print(generator," { ",3);
        }
        else {
          TextGenerator::Print(generator," {\n",3);
          std::__cxx11::string::append((char *)local_78);
        }
        PrintUnknownFields(this,&local_e8,generator);
        pcVar7 = "} ";
        if (this->single_line_mode_ == false) {
          TextGenerator::Outdent(generator);
          pcVar7 = "}\n";
        }
        TextGenerator::Print(generator,pcVar7,2);
        pTVar5 = extraout_RDX_04;
      }
      if (local_e8.fields_ !=
          (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *
          )0x0) {
        UnknownFieldSet::ClearFallback(&local_e8);
        pTVar5 = extraout_RDX_05;
      }
      break;
    case 4:
      TextGenerator::Print(generator,local_98._M_dataplus._M_p,local_98._M_string_length);
      if (this->single_line_mode_ == true) {
        TextGenerator::Print(generator," { ",3);
      }
      else {
        TextGenerator::Print(generator," {\n",3);
        std::__cxx11::string::append((char *)local_78);
      }
      if (*(int *)((long)pUVar6 + lVar9 + -4) != 4) {
        __assert_fail("type() == TYPE_GROUP",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x141,"const UnknownFieldSet &google::protobuf::UnknownField::group() const")
        ;
      }
      PrintUnknownFields(this,*(UnknownFieldSet **)((long)&pUVar6->number_ + lVar9),generator);
      size = 2;
      if (this->single_line_mode_ == false) {
        TextGenerator::Outdent(generator);
        pcVar7 = "}\n";
      }
      else {
        pcVar7 = "} ";
      }
      goto LAB_005d8997;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      pTVar5 = extraout_RDX_01;
    }
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator& generator) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    string field_number = SimpleItoa(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator.Print(field_number);
        generator.Print(": ");
        generator.Print(SimpleItoa(field.varint()));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator.Print(field_number);
        const string& value = field.length_delimited();
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && embedded_unknown_fields.ParseFromString(value)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator.Print(" { ");
          } else {
            generator.Print(" {\n");
            generator.Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator);
          if (single_line_mode_) {
            generator.Print("} ");
          } else {
            generator.Outdent();
            generator.Print("}\n");
          }
        } else {
          // This field is not parseable as a Message.
          // So it is probably just a plain string.
          string printed(": \"");
          CEscapeAndAppend(value, &printed);
          printed.append(single_line_mode_ ? "\" " : "\"\n");
          generator.Print(printed);
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator.Print(field_number);
        if (single_line_mode_) {
          generator.Print(" { ");
        } else {
          generator.Print(" {\n");
          generator.Indent();
        }
        PrintUnknownFields(field.group(), generator);
        if (single_line_mode_) {
          generator.Print("} ");
        } else {
          generator.Outdent();
          generator.Print("}\n");
        }
        break;
    }
  }
}